

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O3

void printXMLOptionString(TidyDoc tdoc,TidyOption topt,OptionDesc *d)

{
  TidyConfigCategory TVar1;
  ctmbstr ptVar2;
  ctmbstr ptVar3;
  
  TVar1 = tidyOptGetCategory(topt);
  if (TVar1 == TidyInternalCategory) {
    return;
  }
  puts(" <option>");
  printf("  <name>%s</name>\n",d->name);
  ptVar2 = tidyGetLanguage();
  ptVar3 = tidyOptGetDoc(tdoc,topt);
  printf("  <string class=\"%s\"><![CDATA[%s]]></string>\n",ptVar2,ptVar3);
  puts(" </option>");
  return;
}

Assistant:

static void printXMLOptionString(TidyDoc tdoc,    /**< The Tidy document. */
                                 TidyOption topt, /**< The option. */
                                 OptionDesc *d    /**< The OptionDesc array. */
                                 )
{
    if ( tidyOptGetCategory(topt) == TidyInternalCategory )
        return;

    printf( " <option>\n" );
    printf( "  <name>%s</name>\n",d->name);
    printf( "  <string class=\"%s\"><![CDATA[%s]]></string>\n", tidyGetLanguage(), tidyOptGetDoc( tdoc, topt ) );
    printf( " </option>\n" );
}